

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::Callbacks::Callbacks
          (Callbacks *this,void *user_data,pfn_allocate alloc_,pfn_free free_,pfn_error error_)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  this->m_user_data = user_data;
  auVar1._8_8_ = free_;
  auVar1._0_8_ = alloc_;
  auVar3._0_4_ = -(uint)((int)alloc_ == 0);
  auVar3._4_4_ = -(uint)((int)((ulong)alloc_ >> 0x20) == 0);
  auVar3._8_4_ = -(uint)((int)free_ == 0);
  auVar3._12_4_ = -(uint)((int)((ulong)free_ >> 0x20) == 0);
  auVar2._4_4_ = auVar3._0_4_;
  auVar2._0_4_ = auVar3._4_4_;
  auVar2._8_4_ = auVar3._12_4_;
  auVar2._12_4_ = auVar3._8_4_;
  auVar4._8_8_ = free_impl;
  auVar4._0_8_ = allocate_impl;
  auVar3 = ~(auVar2 & auVar3) & auVar1 | auVar4 & auVar2 & auVar3;
  this->m_allocate = (pfn_allocate)auVar3._0_8_;
  this->m_free = (pfn_free)auVar3._8_8_;
  if (error_ == (pfn_error)0x0) {
    error_ = error_impl;
  }
  this->m_error = error_;
  return;
}

Assistant:

Callbacks::Callbacks(void *user_data, pfn_allocate alloc_, pfn_free free_, pfn_error error_)
    :
    m_user_data(user_data),
    #ifndef RYML_NO_DEFAULT_CALLBACKS
    m_allocate(alloc_ ? alloc_ : allocate_impl),
    m_free(free_ ? free_ : free_impl),
    m_error(error_ ? error_ : error_impl)
    #else
    m_allocate(alloc_),
    m_free(free_),
    m_error(error_)
    #endif
{
    C4_CHECK(m_allocate);
    C4_CHECK(m_free);
    C4_CHECK(m_error);
}